

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O0

void SdlCallback(void *pUnused,Uint8 *pStream,int Len)

{
  uint in_stack_0000005c;
  short *in_stack_00000060;
  
  Mix(in_stack_00000060,in_stack_0000005c);
  return;
}

Assistant:

static void SdlCallback(void *pUnused, Uint8 *pStream, int Len)
{
	(void)pUnused;
	Mix((short *)pStream, Len/2/2);
}